

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

void gray_render_line(gray_PWorker worker,TPos to_x,TPos to_y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  int ex;
  long lVar8;
  long lVar9;
  ulong uVar10;
  bool local_89;
  long local_88;
  long local_80;
  long dy_r;
  long dx_r;
  TPos prod;
  TCoord ey2;
  TCoord ey1;
  TCoord ex2;
  TCoord ex1;
  TPos fy2;
  TPos fx2;
  TPos fy1;
  TPos fx1;
  TPos dy;
  TPos dx;
  TPos to_y_local;
  TPos to_x_local;
  gray_PWorker worker_local;
  
  prod._4_4_ = (int)((ulong)worker->y >> 8);
  iVar7 = (int)((ulong)to_y >> 8);
  if (((prod._4_4_ < worker->max_ey) || (iVar7 < worker->max_ey)) &&
     ((worker->min_ey <= prod._4_4_ || (worker->min_ey <= iVar7)))) {
    ey1 = (TCoord)((ulong)worker->x >> 8);
    ex = (int)((ulong)to_x >> 8);
    fy1 = worker->x + (long)ey1 * -0x100;
    fx2 = worker->y + (long)prod._4_4_ * -0x100;
    lVar8 = to_x - worker->x;
    lVar9 = to_y - worker->y;
    if ((ey1 != ex) || (prod._4_4_ != iVar7)) {
      if (lVar9 == 0) {
        gray_set_cell(worker,ex,prod._4_4_);
      }
      else if (lVar8 == 0) {
        if (lVar9 < 1) {
          do {
            worker->cover = worker->cover - (int)fx2;
            worker->area = worker->area + -(int)fx2 * (int)fy1 * 2;
            fx2 = 0x100;
            prod._4_4_ = prod._4_4_ + -1;
            gray_set_cell(worker,ey1,prod._4_4_);
          } while (prod._4_4_ != iVar7);
        }
        else {
          do {
            worker->cover = worker->cover + (0x100 - (int)fx2);
            worker->area = worker->area + (0x100 - (int)fx2) * (int)fy1 * 2;
            fx2 = 0;
            prod._4_4_ = prod._4_4_ + 1;
            gray_set_cell(worker,ey1,prod._4_4_);
          } while (prod._4_4_ != iVar7);
        }
      }
      else {
        dx_r = lVar8 * fx2 - lVar9 * fy1;
        if (ey1 == ex) {
          local_80 = 0;
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = SUB168(SEXT816(0xffffffffffffff),8);
          local_80 = SUB168((auVar1 << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar8),0);
        }
        if (prod._4_4_ == iVar7) {
          local_88 = 0;
        }
        else {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = SUB168(SEXT816(0xffffffffffffff),8);
          local_88 = SUB168((auVar2 << 0x40 | ZEXT816(0xffffffffffffff)) / SEXT816(lVar9),0);
        }
        do {
          iVar5 = (int)fy1;
          iVar4 = (int)fx2;
          if ((dx_r < 1) && (0 < dx_r + lVar8 * -0x100)) {
            lVar3 = -dx_r;
            fx2 = (ulong)(lVar3 * -local_80) >> 0x38;
            dx_r = dx_r + lVar9 * -0x100;
            bVar6 = (byte)((ulong)(lVar3 * -local_80) >> 0x38);
            worker->cover = worker->cover + ((uint)bVar6 - iVar4);
            worker->area = worker->area + ((uint)bVar6 - iVar4) * iVar5;
            fy1 = 0x100;
            ey1 = ey1 + -1;
          }
          else if ((dx_r + lVar8 * -0x100 < 1) && (0 < dx_r + lVar8 * -0x100 + lVar9 * 0x100)) {
            dx_r = dx_r + lVar8 * -0x100;
            fy1 = (ulong)(-dx_r * local_88) >> 0x38;
            worker->cover = worker->cover + (0x100 - iVar4);
            worker->area = worker->area +
                           (0x100 - iVar4) *
                           (iVar5 + (uint)(byte)((ulong)(-dx_r * local_88) >> 0x38));
            fx2 = 0;
            prod._4_4_ = prod._4_4_ + 1;
          }
          else if ((dx_r + lVar8 * -0x100 + lVar9 * 0x100 < 1) && (-1 < dx_r + lVar9 * 0x100)) {
            dx_r = lVar9 * 0x100 + dx_r;
            fx2 = (ulong)(dx_r * local_80) >> 0x38;
            bVar6 = (byte)((ulong)(dx_r * local_80) >> 0x38);
            worker->cover = worker->cover + ((uint)bVar6 - iVar4);
            worker->area = worker->area + ((uint)bVar6 - iVar4) * (iVar5 + 0x100);
            fy1 = 0;
            ey1 = ey1 + 1;
          }
          else {
            uVar10 = dx_r * -local_88;
            fy1 = uVar10 >> 0x38;
            dx_r = lVar8 * 0x100 + dx_r;
            worker->cover = worker->cover - iVar4;
            worker->area = worker->area + -iVar4 * (iVar5 + (uint)(byte)(uVar10 >> 0x38));
            fx2 = 0x100;
            prod._4_4_ = prod._4_4_ + -1;
          }
          gray_set_cell(worker,ey1,prod._4_4_);
          local_89 = ey1 != ex || prod._4_4_ != iVar7;
        } while (local_89);
      }
    }
    iVar7 = (int)to_y + iVar7 * -0x100;
    worker->cover = worker->cover + (iVar7 - (int)fx2);
    worker->area = worker->area + (iVar7 - (int)fx2) * ((int)fy1 + (int)to_x + ex * -0x100);
  }
  worker->x = to_x;
  worker->y = to_y;
  return;
}

Assistant:

static void
  gray_render_line( RAS_ARG_ TPos  to_x,
                             TPos  to_y )
  {
    TPos    dx, dy, fx1, fy1, fx2, fy2;
    TCoord  ex1, ex2, ey1, ey2;


    ey1 = TRUNC( ras.y );
    ey2 = TRUNC( to_y );

    /* perform vertical clipping */
    if ( ( ey1 >= ras.max_ey && ey2 >= ras.max_ey ) ||
         ( ey1 <  ras.min_ey && ey2 <  ras.min_ey ) )
      goto End;

    ex1 = TRUNC( ras.x );
    ex2 = TRUNC( to_x );

    fx1 = ras.x - SUBPIXELS( ex1 );
    fy1 = ras.y - SUBPIXELS( ey1 );

    dx = to_x - ras.x;
    dy = to_y - ras.y;

    if ( ex1 == ex2 && ey1 == ey2 )       /* inside one cell */
      ;
    else if ( dy == 0 ) /* ex1 != ex2 */  /* any horizontal line */
    {
      ex1 = ex2;
      gray_set_cell( RAS_VAR_ ex1, ey1 );
    }
    else if ( dx == 0 )
    {
      if ( dy > 0 )                       /* vertical line up */
        do
        {
          fy2 = ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * fx1 * 2;
          fy1 = 0;
          ey1++;
          gray_set_cell( RAS_VAR_ ex1, ey1 );
        } while ( ey1 != ey2 );
      else                                /* vertical line down */
        do
        {
          fy2 = 0;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * fx1 * 2;
          fy1 = ONE_PIXEL;
          ey1--;
          gray_set_cell( RAS_VAR_ ex1, ey1 );
        } while ( ey1 != ey2 );
    }
    else                                  /* any other line */
    {
      TPos  prod = dx * fy1 - dy * fx1;
      FT_UDIVPREP( ex1 != ex2, dx );
      FT_UDIVPREP( ey1 != ey2, dy );


      /* The fundamental value `prod' determines which side and the  */
      /* exact coordinate where the line exits current cell.  It is  */
      /* also easily updated when moving from one cell to the next.  */
      do
      {
        if      ( prod                                   <= 0 &&
                  prod - dx * ONE_PIXEL                  >  0 ) /* left */
        {
          fx2 = 0;
          fy2 = (TPos)FT_UDIV( -prod, -dx );
          prod -= dy * ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = ONE_PIXEL;
          fy1 = fy2;
          ex1--;
        }
        else if ( prod - dx * ONE_PIXEL                  <= 0 &&
                  prod - dx * ONE_PIXEL + dy * ONE_PIXEL >  0 ) /* up */
        {
          prod -= dx * ONE_PIXEL;
          fx2 = (TPos)FT_UDIV( -prod, dy );
          fy2 = ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = fx2;
          fy1 = 0;
          ey1++;
        }
        else if ( prod - dx * ONE_PIXEL + dy * ONE_PIXEL <= 0 &&
                  prod                  + dy * ONE_PIXEL >= 0 ) /* right */
        {
          prod += dy * ONE_PIXEL;
          fx2 = ONE_PIXEL;
          fy2 = (TPos)FT_UDIV( prod, dx );
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = 0;
          fy1 = fy2;
          ex1++;
        }
        else /* ( prod                  + dy * ONE_PIXEL <  0 &&
                  prod                                   >  0 )    down */
        {
          fx2 = (TPos)FT_UDIV( prod, -dy );
          fy2 = 0;
          prod += dx * ONE_PIXEL;
          ras.cover += ( fy2 - fy1 );
          ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );
          fx1 = fx2;
          fy1 = ONE_PIXEL;
          ey1--;
        }

        gray_set_cell( RAS_VAR_ ex1, ey1 );
      } while ( ex1 != ex2 || ey1 != ey2 );
    }

    fx2 = to_x - SUBPIXELS( ex2 );
    fy2 = to_y - SUBPIXELS( ey2 );

    ras.cover += ( fy2 - fy1 );
    ras.area  += ( fy2 - fy1 ) * ( fx1 + fx2 );

  End:
    ras.x       = to_x;
    ras.y       = to_y;
  }